

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O3

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::default_busy_wait>_>
::Consume::move_next(Consume *this)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  
  bVar4 = empty(this);
  if (bVar4) {
    density_tests::detail::assert_failed<unsigned_long&>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xd2,(unsigned_long *)(this + 0x10));
  }
  uVar2 = *(ulong *)(this + 0x10);
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffff0);
  if (0xff < (*(ulong *)(this + 8) ^ uVar2)) {
    LOCK();
    *(long *)(*(long *)this + 0x10) = *(long *)(*(long *)this + 0x10) + 1;
    UNLOCK();
    PageAllocator<density::detail::SystemPageManager<256ul>>::t_instance::__tls_init();
    if (*(long *)(in_FS_OFFSET + -0x30) != 0) {
      PageAllocator<density::detail::SystemPageManager<256UL>_>::process_pending_unpins_impl
                (progress_lock_free);
    }
    LOCK();
    plVar1 = (long *)((uVar2 & 0xffffffffffffff00) + 0xf8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    lVar3 = **(long **)(this + 8);
    density_tests::UnmovableFastTestAllocator<256UL>::unpin_page
              (*(UnmovableFastTestAllocator<256UL> **)this,*(void **)(this + 8));
    if (lVar3 == 0) {
      *(undefined8 **)(this + 8) = puVar5;
      begin_iteration(this,*(LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                             **)this);
      return true;
    }
  }
  *(undefined8 **)(this + 8) = puVar5;
  *(undefined8 *)(this + 0x10) = *puVar5;
  bVar4 = empty(this);
  if ((!bVar4) && (*(ulong *)(this + 0x10) < 0x100)) {
    density_tests::detail::assert_failed<>
              ("empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xed);
  }
  return true;
}

Assistant:

bool move_next() noexcept
                {
                    DENSITY_ASSERT_INTERNAL(!empty(), m_next_ptr);

                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);
                    if (!Base::same_page(m_control, next))
                    {
                        DENSITY_ASSUME(next != nullptr);
                        m_queue->ALLOCATOR_TYPE::pin_page(next);

                        auto const potentially_different_next_ptr =
                          raw_atomic_load(&m_control->m_next, mem_relaxed);

                        m_queue->ALLOCATOR_TYPE::unpin_page(m_control);

                        if (potentially_different_next_ptr == 0)
                        {
                            /* the control block has been zeroed in the meanwhile, we have to restart */
                            m_control = next;
                            begin_iteration(m_queue);
                            return true;
                        }
                    }

                    m_control  = next;
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_relaxed);
                    DENSITY_ASSERT_INTERNAL(
                      empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment);
                    return true;
                }